

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

ON_ModelComponentReference __thiscall
ONX_Model::FirstDimensionStyleFromManagedFontSerialNumber
          (ONX_Model *this,uint managed_font_serial_number,double model_space_text_scale,
          bool bIgnoreSystemDimStyles)

{
  ON_ModelComponentReference *pOVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *mcr;
  bool bVar3;
  bool in_CL;
  uint managed_font_sn;
  undefined7 in_register_00000011;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *mcr_00;
  ON_ModelComponentReference OVar5;
  
  managed_font_sn = (uint)CONCAT71(in_register_00000011,bIgnoreSystemDimStyles);
  mcr_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (CONCAT44(in_register_00000034,managed_font_serial_number) + 0x8b8);
  bVar3 = Internal_DimStyleHasFont
                    ((ON_ModelComponentReference *)mcr_00,managed_font_sn,model_space_text_scale,
                     in_CL);
  if (!bVar3) {
    lVar2 = *(long *)(CONCAT44(in_register_00000034,managed_font_serial_number) + 0x8c8);
    lVar4 = 0xc0;
    if (*(int *)(lVar2 + 0x20) < 9) {
      lVar4 = 0;
    }
    pOVar1 = (ON_ModelComponentReference *)(*(long *)(lVar2 + 0x18) + lVar4);
    while ((mcr = (pOVar1->m_sp).super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi,
           mcr_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    &ON_ModelComponentReference::Empty,
           mcr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
           (bVar3 = Internal_DimStyleHasFont
                              ((ON_ModelComponentReference *)mcr,managed_font_sn,
                               model_space_text_scale,in_CL), mcr_00 = mcr, !bVar3))) {
      pOVar1 = (ON_ModelComponentReference *)(mcr + 1);
    }
  }
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,(ON_ModelComponentReference *)mcr_00);
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::FirstDimensionStyleFromManagedFontSerialNumber(
  unsigned int managed_font_serial_number,
  double model_space_text_scale,
  bool bIgnoreSystemDimStyles
) const
{
  if (Internal_DimStyleHasFont(m_default_dimension_style, managed_font_serial_number, model_space_text_scale, bIgnoreSystemDimStyles))
    return m_default_dimension_style;

  for (
    ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::DimStyle).m_first_mcr_link;
    nullptr != link;
    link = link->m_next
    )
  {
    if (Internal_DimStyleHasFont(link->m_mcr, managed_font_serial_number, model_space_text_scale, bIgnoreSystemDimStyles))
      return link->m_mcr;
  }

  return ON_ModelComponentReference::Empty;
}